

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O3

uint32_t penguinV::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  imageException *this_00;
  ImageTypeManager *pIVar4;
  SumForm2 p_Var5;
  uint8_t uVar6;
  ImageManager manager;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  pointer ppRStack_80;
  pointer ppRStack_78;
  pointer ppRStack_70;
  pointer pIStack_68;
  pointer pIStack_60;
  pointer pIStack_58;
  pointer pIStack_50;
  pointer pIStack_48;
  pointer pIStack_40;
  uint8_t local_38;
  
  this = ImageTypeManager::instance();
  pFVar3 = ImageTypeManager::functionTable(this,image->_type);
  p_Var5 = pFVar3->Sum;
  uVar6 = image->_type;
  if (p_Var5 != (SumForm2)0x0) {
LAB_0012b645:
    local_a0._0_8_ = ImageTypeManager::instance();
    local_a0._8_8_ = (pointer)0x0;
    local_a0._16_8_ = (pointer)0x0;
    local_a0._24_8_ = (pointer)0x0;
    ppRStack_80 = (pointer)0x0;
    ppRStack_78 = (pointer)0x0;
    ppRStack_70 = (pointer)0x0;
    pIStack_68 = (pointer)0x0;
    pIStack_60 = (pointer)0x0;
    pIStack_58 = (pointer)0x0;
    pIStack_50 = (pointer)0x0;
    pIStack_48 = (pointer)0x0;
    pIStack_40 = (pointer)0x0;
    local_38 = uVar6;
    uVar2 = (*p_Var5)(image,x,y,width,height);
    anon_unknown.dwarf_d7bd2::ImageManager::~ImageManager((ImageManager *)local_a0);
    return uVar2;
  }
  bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
  if (bVar1) {
    ImageTypeManager::imageTypes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,this);
    pIVar4 = (ImageTypeManager *)local_a0._0_8_;
    if (local_a0._0_8_ == local_a0._8_8_) {
      p_Var5 = (SumForm2)0x0;
    }
    else {
      do {
        pFVar3 = ImageTypeManager::functionTable
                           (this,*(uint8_t *)&(pIVar4->_functionTableMap)._M_t._M_impl);
        p_Var5 = pFVar3->Sum;
        if (p_Var5 != (SumForm2)0x0) {
          uVar6 = *(uint8_t *)&(pIVar4->_functionTableMap)._M_t._M_impl;
          break;
        }
        pIVar4 = (ImageTypeManager *)&(pIVar4->_functionTableMap)._M_t._M_impl.field_0x1;
      } while (pIVar4 != (ImageTypeManager *)local_a0._8_8_);
    }
    if ((ImageTypeManager *)local_a0._0_8_ != (ImageTypeManager *)0x0) {
      operator_delete((void *)local_a0._0_8_);
    }
    if (p_Var5 != (SumForm2)0x0) goto LAB_0012b645;
  }
  local_100.field_2._M_allocated_capacity._0_4_ = 0x6d7553;
  local_e0.field_2._M_allocated_capacity = 0x6e6f6974636e7546;
  local_e0.field_2._8_2_ = 0x20;
  local_e0._M_string_length = 9;
  local_100._M_string_length = 3;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::operator+(&local_c0,&local_e0,&local_100);
  local_120.field_2._M_allocated_capacity._0_7_ = 0x746f6e20736920;
  local_120.field_2._M_local_buf[7] = ' ';
  local_120.field_2._8_7_ = 0x64656e69666564;
  local_120._M_string_length = 0xf;
  local_120.field_2._M_local_buf[0xf] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,(char *)local_a0._0_8_);
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        initialize( image, Sum );
        return func( image, x, y, width, height );
    }